

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

int test_miniz(uchar *s_pStr,uLong data_len)

{
  int iVar1;
  mz_ulong __size;
  uchar *pDest;
  uchar *pDest_00;
  char *__s;
  uLong cmp_len;
  uLong uncomp_len;
  mz_ulong local_30;
  uLong local_28;
  
  __size = mz_compressBound(data_len);
  local_30 = __size;
  local_28 = data_len;
  printf("miniz.c version: %s\n","10.0.2");
  pDest = (uchar *)malloc(__size);
  pDest_00 = (uchar *)malloc(data_len);
  if (pDest == (uchar *)0x0 || pDest_00 == (uchar *)0x0) {
    puts("Out of memory!");
  }
  else {
    iVar1 = mz_compress(pDest,&local_30,s_pStr,data_len);
    if (iVar1 == 0) {
      printf("Compressed from %u to %u bytes\n",data_len & 0xffffffff,local_30 & 0xffffffff);
      iVar1 = mz_uncompress(pDest_00,&local_28,pDest,local_30);
      if (iVar1 == 0) {
        printf("Decompressed from %u to %u bytes\n",local_30 & 0xffffffff,local_28 & 0xffffffff);
        if ((local_28 == data_len) && (iVar1 = bcmp(pDest_00,s_pStr,data_len), iVar1 == 0)) {
          free(pDest);
          free(pDest_00);
          puts("Success.");
          return 0;
        }
        __s = "Decompression failed!";
      }
      else {
        __s = "uncompress failed!";
      }
    }
    else {
      __s = "compress() failed!";
    }
    puts(__s);
    free(pDest);
    free(pDest_00);
  }
  return 1;
}

Assistant:

int test_miniz(const unsigned char *s_pStr, uLong data_len) {
    int cmp_status;
    uLong src_len = data_len;
    uLong cmp_len = compressBound(src_len);
    uLong uncomp_len = src_len;
    uint8_t *pCmp, *pUncomp;
    printf("miniz.c version: %s\n", MZ_VERSION);
    // Allocate buffers to hold compressed and uncompressed data.
    pCmp = (mz_uint8 *) malloc((size_t) cmp_len);
    pUncomp = (mz_uint8 *) malloc((size_t) src_len);
    if ((!pCmp) || (!pUncomp)) {
        printf("Out of memory!\n");
        return EXIT_FAILURE;
    }
    // Compress the string.
    cmp_status = compress(pCmp, &cmp_len, (const unsigned char *) s_pStr, src_len);
    if (cmp_status != Z_OK) {
        printf("compress() failed!\n");
        free(pCmp);
        free(pUncomp);
        return EXIT_FAILURE;
    }
    printf("Compressed from %u to %u bytes\n", (mz_uint32) src_len, (mz_uint32) cmp_len);
    // Decompress.
    cmp_status = uncompress(pUncomp, &uncomp_len, pCmp, cmp_len);
    if (cmp_status != Z_OK) {
        printf("uncompress failed!\n");
        free(pCmp);
        free(pUncomp);
        return EXIT_FAILURE;
    }
    printf("Decompressed from %u to %u bytes\n", (mz_uint32) cmp_len, (mz_uint32) uncomp_len);
    // Ensure uncompress() returned the expected data.
    if ((uncomp_len != src_len) || (memcmp(pUncomp, s_pStr, (size_t) src_len))) {
        printf("Decompression failed!\n");
        free(pCmp);
        free(pUncomp);
        return EXIT_FAILURE;
    }
    free(pCmp);
    free(pUncomp);
    printf("Success.\n");
    return EXIT_SUCCESS;

}